

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::Append2(char *out,AlphaNum *x1,AlphaNum *x2)

{
  size_t sVar1;
  char *pcVar2;
  AlphaNum *x2_local;
  AlphaNum *x1_local;
  char *out_local;
  
  sVar1 = strings::AlphaNum::size(x1);
  x1_local = (AlphaNum *)out;
  if (sVar1 != 0) {
    pcVar2 = strings::AlphaNum::data(x1);
    sVar1 = strings::AlphaNum::size(x1);
    memcpy(out,pcVar2,sVar1);
    sVar1 = strings::AlphaNum::size(x1);
    x1_local = (AlphaNum *)(out + sVar1);
  }
  sVar1 = strings::AlphaNum::size(x2);
  if (sVar1 != 0) {
    pcVar2 = strings::AlphaNum::data(x2);
    sVar1 = strings::AlphaNum::size(x2);
    memcpy(x1_local,pcVar2,sVar1);
    sVar1 = strings::AlphaNum::size(x2);
    x1_local = (AlphaNum *)(x1_local->digits + (sVar1 - 0x10));
  }
  return (char *)x1_local;
}

Assistant:

static char *Append2(char *out, const AlphaNum &x1, const AlphaNum &x2) {
  if (x1.size() > 0) {
    memcpy(out, x1.data(), x1.size());
    out += x1.size();
  }
  if (x2.size() > 0) {
    memcpy(out, x2.data(), x2.size());
    out += x2.size();
  }
  return out;
}